

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int ERKStepCreateAdjointStepper
              (void *arkode_mem,SUNAdjRhsFn adj_f,sunrealtype tf,N_Vector sf,
              SUNContext_conflict sunctx,SUNAdjointStepper *adj_stepper_ptr)

{
  int iVar1;
  void *pvVar2;
  void *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 *in_R8;
  undefined8 in_XMM0_Qa;
  SUNStepper_conflict adj_stepper;
  SUNStepper_conflict fwd_stepper;
  SUNErrCode errcode;
  ARKodeERKStepMem step_mem_adj;
  ARKodeMem ark_mem_adj;
  void *arkode_mem_adj;
  long nst;
  int retval;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffff58;
  SUNAdjointCheckpointScheme in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  undefined8 *arkode_mem_00;
  ARKodeERKStepMem in_stack_ffffffffffffff70;
  ARKodeMem in_stack_ffffffffffffff78;
  ARKodeButcherTable in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ARKodeMem local_40;
  uint local_4;
  
  iVar1 = erkStep_AccessARKODEStepMem
                    (in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58,(ARKodeERKStepMem *)0x1535e0);
  if (iVar1 == 0) {
    iVar1 = erkStepCompatibleWithAdjointSolver
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                       (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                       (char *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    if (iVar1 == 0) {
      if (in_RSI == 0) {
        arkProcessError(local_40,-0x16,0x6bf,"ERKStepCreateAdjointStepper",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                        ,"adj_fe cannot be NULL.");
        local_4 = 0xffffffea;
      }
      else {
        iVar1 = N_VGetVectorID(in_RDX);
        if (iVar1 == 0xd) {
          local_4 = ARKodeGetNumSteps(in_stack_ffffffffffffff68,(long *)in_stack_ffffffffffffff60);
          if (local_4 == 0) {
            pvVar2 = ERKStepCreate((ARKRhsFn)
                                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                   (sunrealtype)in_stack_ffffffffffffff80,
                                   (N_Vector)in_stack_ffffffffffffff78,
                                   (SUNContext_conflict)in_stack_ffffffffffffff70);
            if (pvVar2 == (void *)0x0) {
              arkProcessError(local_40,-0x15,0x6da,"ERKStepCreateAdjointStepper",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                              ,"ERKStepCreate returned NULL\n");
              local_4 = 0xffffffeb;
            }
            else {
              *(long *)(*(long *)((long)pvVar2 + 0x88) + 8) = in_RSI;
              *(undefined4 *)((long)pvVar2 + 0x410) = 1;
              local_4 = ARKodeSetFixedStep(in_stack_ffffffffffffff68,
                                           (sunrealtype)in_stack_ffffffffffffff60);
              if (local_4 == 0) {
                local_4 = ERKStepSetTable((void *)CONCAT44(in_stack_ffffffffffffff8c,
                                                           in_stack_ffffffffffffff88),
                                          in_stack_ffffffffffffff80);
                if (local_4 == 0) {
                  local_4 = ARKodeSetMaxNumSteps
                                      (in_stack_ffffffffffffff68,(long)in_stack_ffffffffffffff60);
                  if (local_4 == 0) {
                    local_4 = ARKodeSetAdjointCheckpointScheme
                                        (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
                    if (local_4 == 0) {
                      local_4 = ARKodeCreateSUNStepper
                                          (in_stack_ffffffffffffff68,
                                           (SUNStepper *)in_stack_ffffffffffffff60);
                      if (local_4 == 0) {
                        iVar1 = SUNStepper_SetReInitFn
                                          (in_stack_ffffffffffffff80,erkStep_SUNStepperReInit);
                        if (iVar1 == 0) {
                          local_4 = ARKodeCreateSUNStepper
                                              (in_stack_ffffffffffffff68,
                                               (SUNStepper *)in_stack_ffffffffffffff60);
                          if (local_4 == 0) {
                            iVar1 = SUNStepper_SetReInitFn
                                              (in_stack_ffffffffffffff78,erkStep_SUNStepperReInit);
                            if (iVar1 == 0) {
                              iVar1 = SUNStepper_SetDestroyFn
                                                (in_stack_ffffffffffffff78,arkSUNStepperSelfDestruct
                                                );
                              if (iVar1 == 0) {
                                arkode_mem_00 = in_R8;
                                iVar1 = SUNAdjointStepper_Create
                                                  (in_XMM0_Qa,in_stack_ffffffffffffff80,1,
                                                   in_stack_ffffffffffffff78,1,0xffffffffffffffff,
                                                   in_RDX,local_40->checkpoint_scheme);
                                if (iVar1 == 0) {
                                  iVar1 = SUNAdjointStepper_SetUserData(*in_R8,local_40->user_data);
                                  if (iVar1 == 0) {
                                    local_4 = ARKodeSetUserData(arkode_mem_00,in_RCX);
                                    if (local_4 == 0) {
                                      local_4 = 0;
                                    }
                                    else {
                                      arkProcessError(local_40,(int)(ulong)local_4,0x750,
                                                      "ERKStepCreateAdjointStepper",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                                  ,"ARKodeSetUserData failed");
                                    }
                                  }
                                  else {
                                    arkProcessError(local_40,-0x37,0x746,
                                                    "ERKStepCreateAdjointStepper",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                                  ,"SUNAdjointStepper_SetUserData failed");
                                    local_4 = 0xffffffc9;
                                  }
                                }
                                else {
                                  arkProcessError(local_40,-0x37,0x73d,"ERKStepCreateAdjointStepper"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                                  ,"SUNAdjointStepper_Create failed");
                                  local_4 = 0xffffffc9;
                                }
                              }
                              else {
                                arkProcessError(local_40,-0x33,0x731,"ERKStepCreateAdjointStepper",
                                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                                ,"SUNStepper_SetDestroyFn failed");
                                local_4 = 0xffffffcd;
                              }
                            }
                            else {
                              arkProcessError(local_40,-0x33,0x726,"ERKStepCreateAdjointStepper",
                                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                              ,"SUNStepper_SetReInitFn failed");
                              local_4 = 0xffffffcd;
                            }
                          }
                          else {
                            arkProcessError(local_40,(int)(ulong)local_4,0x71d,
                                            "ERKStepCreateAdjointStepper",
                                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                            ,"ARKodeCreateSUNStepper failed");
                          }
                        }
                        else {
                          arkProcessError(local_40,-0x33,0x714,"ERKStepCreateAdjointStepper",
                                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                          ,"SUNStepper_SetReInitFn failed");
                          local_4 = 0xffffffcd;
                        }
                      }
                      else {
                        arkProcessError(local_40,(int)(ulong)local_4,0x70b,
                                        "ERKStepCreateAdjointStepper",
                                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                        ,"ARKodeCreateSUNStepper failed");
                      }
                    }
                    else {
                      arkProcessError(local_40,(int)(ulong)local_4,0x700,
                                      "ERKStepCreateAdjointStepper",
                                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                      ,"ARKodeSetAdjointCheckpointScheme failed");
                    }
                  }
                  else {
                    arkProcessError(local_40,(int)(ulong)local_4,0x6f7,"ERKStepCreateAdjointStepper"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                    ,"ARKodeSetMaxNumSteps failed");
                  }
                }
                else {
                  arkProcessError(local_40,(int)(ulong)local_4,0x6ef,"ERKStepCreateAdjointStepper",
                                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                  ,"ERKStepSetTables failed");
                }
              }
              else {
                arkProcessError(local_40,(int)(ulong)local_4,0x6e7,"ERKStepCreateAdjointStepper",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                                ,"ARKodeSetFixedStep failed");
              }
            }
          }
          else {
            arkProcessError(local_40,(int)(ulong)local_4,0x6d2,"ERKStepCreateAdjointStepper",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                            ,"ARKodeGetNumSteps failed");
          }
        }
        else {
          arkProcessError(local_40,-0x16,0x6c6,"ERKStepCreateAdjointStepper",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                          ,"Incompatible vector type provided for adjoint calculation");
          local_4 = 0xffffffea;
        }
      }
    }
    else {
      arkProcessError(local_40,-0x16,0x6b8,"ERKStepCreateAdjointStepper",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                      ,"ark_mem provided is not compatible with adjoint calculation");
      local_4 = 0xffffffea;
    }
  }
  else {
    arkProcessError((ARKodeMem)0x0,-0x16,0x6b0,"ERKStepCreateAdjointStepper",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"The ERKStep memory pointer is NULL");
    local_4 = 0xffffffea;
  }
  return local_4;
}

Assistant:

int ERKStepCreateAdjointStepper(void* arkode_mem, SUNAdjRhsFn adj_f,
                                sunrealtype tf, N_Vector sf, SUNContext sunctx,
                                SUNAdjointStepper* adj_stepper_ptr)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval = erkStep_AccessARKODEStepMem(arkode_mem,
                                           "ERKStepCreateAdjointStepper",
                                           &ark_mem, &step_mem);
  if (retval)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "The ERKStep memory pointer is NULL");
    return ARK_ILL_INPUT;
  }

  if (erkStepCompatibleWithAdjointSolver(ark_mem, step_mem, __LINE__, __func__,
                                         __FILE__))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "ark_mem provided is not compatible with adjoint calculation");
    return ARK_ILL_INPUT;
  }

  if (!adj_f)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "adj_fe cannot be NULL.");
    return ARK_ILL_INPUT;
  }

  if (N_VGetVectorID(sf) != SUNDIALS_NVEC_MANYVECTOR)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Incompatible vector type provided for adjoint calculation");
    return ARK_ILL_INPUT;
  }

  /**
    Create and configure the ERKStep stepper for the adjoint system
  */
  long nst = 0;
  retval   = ARKodeGetNumSteps(arkode_mem, &nst);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeGetNumSteps failed");
    return retval;
  }

  void* arkode_mem_adj = ERKStepCreate(erkStep_fe_Adj, tf, sf, ark_mem->sunctx);
  if (!arkode_mem_adj)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ERKStepCreate returned NULL\n");
    return ARK_MEM_NULL;
  }
  ARKodeMem ark_mem_adj         = (ARKodeMem)arkode_mem_adj;
  ARKodeERKStepMem step_mem_adj = (ARKodeERKStepMem)ark_mem_adj->step_mem;

  step_mem_adj->adj_f     = adj_f;
  ark_mem_adj->do_adjoint = SUNTRUE;

  retval = ARKodeSetFixedStep(arkode_mem_adj, -ark_mem->h);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetFixedStep failed");
    return retval;
  }

  retval = ERKStepSetTable(arkode_mem_adj, step_mem->B);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ERKStepSetTables failed");
    return retval;
  }

  retval = ARKodeSetMaxNumSteps(arkode_mem_adj, nst);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetMaxNumSteps failed");
    return retval;
  }

  retval = ARKodeSetAdjointCheckpointScheme(arkode_mem_adj,
                                            ark_mem->checkpoint_scheme);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetAdjointCheckpointScheme failed");
    return retval;
  }

  SUNErrCode errcode = SUN_SUCCESS;

  SUNStepper fwd_stepper;
  retval = ARKodeCreateSUNStepper(arkode_mem, &fwd_stepper);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeCreateSUNStepper failed");
    return retval;
  }

  errcode = SUNStepper_SetReInitFn(fwd_stepper, erkStep_SUNStepperReInit);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetReInitFn failed");
    return retval;
  }

  SUNStepper adj_stepper;
  retval = ARKodeCreateSUNStepper(arkode_mem_adj, &adj_stepper);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeCreateSUNStepper failed");
    return retval;
  }

  errcode = SUNStepper_SetReInitFn(adj_stepper, erkStep_SUNStepperReInit);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetReInitFn failed");
    return retval;
  }

  /* Setting this ensures that the ARKodeMem underneath the adj_stepper
     is destroyed with the SUNStepper_Destroy call. */
  errcode = SUNStepper_SetDestroyFn(adj_stepper, arkSUNStepperSelfDestruct);
  if (errcode)
  {
    retval = ARK_SUNSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNStepper_SetDestroyFn failed");
    return retval;
  }

  /* SUNAdjointStepper will own the SUNSteppers and destroy them */
  errcode = SUNAdjointStepper_Create(fwd_stepper, SUNTRUE, adj_stepper, SUNTRUE,
                                     nst - 1, tf, sf, ark_mem->checkpoint_scheme,
                                     sunctx, adj_stepper_ptr);
  if (errcode)
  {
    retval = ARK_SUNADJSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNAdjointStepper_Create failed");
    return retval;
  }

  errcode = SUNAdjointStepper_SetUserData(*adj_stepper_ptr, ark_mem->user_data);
  if (errcode)
  {
    retval = ARK_SUNADJSTEPPER_ERR;
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "SUNAdjointStepper_SetUserData failed");
    return retval;
  }

  /* We need access to the adjoint solver to access the parameter Jacobian inside of ERKStep's
     backwards integration of the the adjoint problem. */
  retval = ARKodeSetUserData(arkode_mem_adj, *adj_stepper_ptr);
  if (retval)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "ARKodeSetUserData failed");
    return retval;
  }

  return ARK_SUCCESS;
}